

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O2

CharString * __thiscall
icu_63::CharString::appendInvariantChars(CharString *this,UnicodeString *s,UErrorCode *errorCode)

{
  short sVar1;
  char16_t *uchars;
  CharString *pCVar2;
  int32_t ucharsLen;
  
  uchars = UnicodeString::getBuffer(s);
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    ucharsLen = (s->fUnion).fFields.fLength;
  }
  else {
    ucharsLen = (int)sVar1 >> 5;
  }
  pCVar2 = appendInvariantChars(this,uchars,ucharsLen,errorCode);
  return pCVar2;
}

Assistant:

CharString &CharString::appendInvariantChars(const UnicodeString &s, UErrorCode &errorCode) {
    return appendInvariantChars(s.getBuffer(), s.length(), errorCode);
}